

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportCameras(glTF2Importer *this,Asset *r)

{
  char *pcVar1;
  Camera *pCVar2;
  uint uVar3;
  ulong uVar4;
  aiCamera **ppaVar5;
  aiCamera *this_00;
  float local_60;
  aiVector3t<float> local_3c;
  aiCamera *local_30;
  aiCamera *aicam;
  Camera *cam;
  size_t i;
  Asset *r_local;
  glTF2Importer *this_local;
  
  i = (size_t)r;
  r_local = (Asset *)this;
  uVar3 = glTF2::LazyDict<glTF2::Camera>::Size(&r->cameras);
  if (uVar3 != 0) {
    uVar3 = glTF2::LazyDict<glTF2::Camera>::Size((LazyDict<glTF2::Camera> *)(i + 0x3c0));
    this->mScene->mNumCameras = uVar3;
    uVar3 = glTF2::LazyDict<glTF2::Camera>::Size((LazyDict<glTF2::Camera> *)(i + 0x3c0));
    uVar4 = SUB168(ZEXT416(uVar3) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uVar3) * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiCamera **)operator_new__(uVar4);
    this->mScene->mCameras = ppaVar5;
    for (cam = (Camera *)0x0; pCVar2 = cam,
        uVar3 = glTF2::LazyDict<glTF2::Camera>::Size((LazyDict<glTF2::Camera> *)(i + 0x3c0)),
        pCVar2 < (Camera *)(ulong)uVar3;
        cam = (Camera *)((long)&(cam->super_Object)._vptr_Object + 1)) {
      aicam = (aiCamera *)
              glTF2::LazyDict<glTF2::Camera>::operator[]
                        ((LazyDict<glTF2::Camera> *)(i + 0x3c0),(size_t)cam);
      this_00 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(this_00);
      this->mScene->mCameras[(long)cam] = this_00;
      local_30 = this_00;
      aiVector3t<float>::aiVector3t(&local_3c,0.0,0.0,-1.0);
      (local_30->mLookAt).x = local_3c.x;
      (local_30->mLookAt).y = local_3c.y;
      (local_30->mLookAt).z = local_3c.z;
      if (*(int *)((aicam->mName).data + 0x4c) == 0) {
        local_30->mAspect = *(float *)((aicam->mName).data + 0x50);
        if ((local_30->mAspect != 0.0) || (NAN(local_30->mAspect))) {
          local_60 = local_30->mAspect;
        }
        else {
          local_60 = 1.0;
        }
        local_30->mHorizontalFOV = *(float *)((aicam->mName).data + 0x54) * local_60;
        local_30->mClipPlaneFar = *(float *)((aicam->mName).data + 0x58);
        local_30->mClipPlaneNear = *(float *)((aicam->mName).data + 0x5c);
      }
      else {
        local_30->mClipPlaneFar = *(float *)((aicam->mName).data + 0x58);
        local_30->mClipPlaneNear = *(float *)((aicam->mName).data + 0x5c);
        local_30->mHorizontalFOV = 0.0;
        local_30->mAspect = 1.0;
        pcVar1 = (aicam->mName).data + 0x54;
        if ((*(float *)pcVar1 != 0.0) || (NAN(*(float *)pcVar1))) {
          local_30->mAspect =
               *(float *)((aicam->mName).data + 0x50) / *(float *)((aicam->mName).data + 0x54);
        }
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportCameras(glTF2::Asset& r)
{
    if (!r.cameras.Size()) return;

    mScene->mNumCameras = r.cameras.Size();
    mScene->mCameras = new aiCamera*[r.cameras.Size()];

    for (size_t i = 0; i < r.cameras.Size(); ++i) {
        Camera& cam = r.cameras[i];

        aiCamera* aicam = mScene->mCameras[i] = new aiCamera();

        // cameras point in -Z by default, rest is specified in node transform
        aicam->mLookAt = aiVector3D(0.f,0.f,-1.f);

        if (cam.type == Camera::Perspective) {

            aicam->mAspect        = cam.cameraProperties.perspective.aspectRatio;
            aicam->mHorizontalFOV = cam.cameraProperties.perspective.yfov * ((aicam->mAspect == 0.f) ? 1.f : aicam->mAspect);
            aicam->mClipPlaneFar  = cam.cameraProperties.perspective.zfar;
            aicam->mClipPlaneNear = cam.cameraProperties.perspective.znear;
        } else {
            aicam->mClipPlaneFar = cam.cameraProperties.ortographic.zfar;
            aicam->mClipPlaneNear = cam.cameraProperties.ortographic.znear;
            aicam->mHorizontalFOV = 0.0;
            aicam->mAspect = 1.0f;
            if (0.f != cam.cameraProperties.ortographic.ymag ) {
                aicam->mAspect = cam.cameraProperties.ortographic.xmag / cam.cameraProperties.ortographic.ymag;
            }
        }
    }
}